

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

string * __thiscall
pbrt::SquareMatrix<2>::ToString_abi_cxx11_(string *__return_storage_ptr__,SquareMatrix<2> *this)

{
  float *in_RCX;
  long lVar1;
  long lVar2;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[ [",(allocator<char> *)&local_50);
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 4) {
      StringPrintf<float_const&>
                (&local_50,(pbrt *)0x52c466,
                 (char *)((long)*(Float (*) [2])*(Float (*) [2])this + lVar1),in_RCX);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      if (lVar1 == 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    if (lVar2 == 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    this = (SquareMatrix<2> *)((long)this + 8);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SquareMatrix<N>::ToString() const {
    std::string s = "[ [";
    for (int i = 0; i < N; ++i) {
        for (int j = 0; j < N; ++j) {
            s += StringPrintf(" %f", m[i][j]);
            if (j < N - 1)
                s += ',';
            else
                s += " ]";
        }
        if (i < N - 1)
            s += ", [";
    }
    s += " ]";
    return s;
}